

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetpmu.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  code *pcVar6;
  code *pcVar7;
  ulong uVar8;
  ulong uVar9;
  int hostmem;
  uint64_t pte;
  uint64_t phys_pages [256];
  undefined4 local_844;
  undefined8 local_840;
  ulong local_838 [257];
  
  iVar4 = nva_init();
  if (iVar4 == 0) {
    if (0 < argc) {
      uVar9 = 0;
      do {
        iVar4 = strcmp("--help",argv[uVar9]);
        if (iVar4 == 0) {
          puts("Retrieves PMU from the GPU.\nJust run, and pipe output tofile.");
          return 0;
        }
        uVar9 = uVar9 + 1;
      } while ((uint)argc != uVar9);
    }
    puVar2 = (uint *)(*nva_cards)->bar0;
    uVar5 = *puVar2 >> 0x14 & 0x1ff;
    if (uVar5 - 0x100 < 0xffffffa3) {
      main_cold_3();
    }
    else {
      pcVar6 = gf100_pte_from_pde;
      if (uVar5 < 0xc0) {
        pcVar6 = g80_pte_from_pde;
      }
      pcVar7 = gf100_physpages_from_pt;
      if (uVar5 < 0xc0) {
        pcVar7 = g80_physpages_from_pt;
      }
      if ((~puVar2[0x42844] & 0x7ff00) == 0) {
        if ((puVar2[0x4291f] & 0xf0000000) == 0x70000000) {
          iVar4 = (*pcVar6)((ulong)(puVar2[0x4291f] & 0xfffffff) << 0xc,&local_840,&local_844);
          if (iVar4 == 0) {
            uVar5 = (*pcVar7)(local_840,local_844,local_838);
            if (0 < (int)uVar5) {
              uVar9 = 0;
              do {
                uVar3 = local_838[uVar9];
                *(uint *)((long)(*nva_cards)->bar0 + 0x1700) =
                     (uint)(uVar3 >> 0x10) & 0xffffff | 0x2000000;
                uVar8 = 0xfffffffffffffffc;
                do {
                  uVar1 = *(uint *)((long)(*nva_cards)->bar0 +
                                   uVar8 + 4 + (uVar3 & 0xffff | 0x700000));
                  printf("%c%c%c%c",(ulong)uVar1,uVar1 >> 8,(ulong)(uVar1 >> 0x10),
                         (ulong)(uVar1 >> 0x18));
                  uVar8 = uVar8 + 4;
                } while (uVar8 < 0xffc);
                uVar9 = uVar9 + 1;
              } while (uVar9 != uVar5);
            }
            return 0;
          }
          return iVar4;
        }
        main_cold_2();
      }
      else {
        main_cold_1();
      }
    }
  }
  else {
    puts("Init failed");
  }
  return -1;
}

Assistant:

int main(int argc, char **argv)
{
	int i = 0, j = 0;
	uint32_t tmp_reg;
	uint32_t boot0;
	uint64_t chan_ptr, pte;
	int hostmem;
	int ret;

	int (*pte_from_pde)(uint64_t, uint64_t *, int *);
	int (*physpages_from_pt)(uint64_t, int , uint64_t *);

	uint32_t hi = 0,lo = 0;
	uint64_t phys_pages[256];
	int entries = 0;

	if (nva_init()) {
		printf("Init failed\n");
		return -1;
	}

	for (i = 0; i < argc; i++) {
		if(strcmp("--help",argv[i]) == 0) {
			help();
			return 0;
		}
	}

	// Check card generation
	boot0 = (peek(0x0) & 0x1ff00000) >> 20;
	if (boot0 < 0xa3 || boot0 >= 0x100){
		fprintf(stderr,"Card unsupported.\n");
		return -1;
	} else if (boot0 < 0xc0) {
		pte_from_pde = g80_pte_from_pde;
		physpages_from_pt = g80_physpages_from_pt;
	} else {
		pte_from_pde = gf100_pte_from_pde;
		physpages_from_pt = gf100_physpages_from_pt;
	}

	// First checking xfer-ext base to see if the fuc code was uploaded
	tmp_reg = peek(0x10a110);
	tmp_reg = tmp_reg & 0xffffff00;
	if ((tmp_reg & 0x0007ff00) != 0x0007ff00) {
		fprintf(stderr,"Register 0x10a110 not in order\n");
		return -1;
	}

	// Is channel set up?
	tmp_reg = peek(0x10a47c);
	if ((tmp_reg  & 0xf0000000) != 0x70000000) {
		fprintf(stderr,"Channel not set up\n");
		return -1;
	}

	// Find the pagetable based on this info
	chan_ptr = ((tmp_reg & 0x0fffffffull) << 12ull) &
			0x000000ffffffffffull; // XXX: Mask?
	ret = pte_from_pde(chan_ptr, &pte, &hostmem);

	if (ret)
		return ret;

	entries = physpages_from_pt(pte, hostmem, phys_pages);

	// And output the fuc codes
	for (i = 0; i < entries; i++) {
		hi = (phys_pages[i] & 0xffffff0000ull) >> 16ull;
		lo = phys_pages[i] & 0x0000ffff;
		poke(0x1700, hi | 0x2000000);

		// Read 4K from here and output this
		for (j = 0; j < 4096; j=j+4) {
			tmp_reg = peek(0x700000+lo+j);
			printf("%c%c%c%c",tmp_reg, tmp_reg>>8, tmp_reg>>16,
					tmp_reg>>24);
		}
	}

	return 0;
}